

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::api::json::
ExecuteDirectApi<cfd::api::json::DecodePsbtRequest,cfd::api::json::DecodePsbtResponse>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<void_(cfd::api::json::DecodePsbtRequest_*,_cfd::api::json::DecodePsbtResponse_*)>
          *function)

{
  DecodePsbtRequest req;
  DecodePsbtResponse response;
  DecodePsbtResponse *local_280;
  DecodePsbtRequest *local_278 [4];
  DecodePsbtRequest local_258;
  DecodePsbtResponse local_1d8;
  
  DecodePsbtRequest::DecodePsbtRequest(&local_258);
  core::JsonClassBase<cfd::api::json::DecodePsbtRequest>::Deserialize
            (&local_258.super_JsonClassBase<cfd::api::json::DecodePsbtRequest>,(string *)this);
  DecodePsbtResponse::DecodePsbtResponse(&local_1d8);
  local_280 = &local_1d8;
  local_278[0] = &local_258;
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(request_message,local_278,&local_280);
    core::JsonClassBase<cfd::api::json::DecodePsbtResponse>::Serialize_abi_cxx11_
              (__return_storage_ptr__,
               &local_1d8.super_JsonClassBase<cfd::api::json::DecodePsbtResponse>);
    DecodePsbtResponse::~DecodePsbtResponse(&local_1d8);
    DecodePsbtRequest::~DecodePsbtRequest(&local_258);
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}